

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O3

FT_Error ft_svg_property_get(FT_Module module,char *property_name,void *value)

{
  FT_Memory pFVar1;
  FT_Module_Class *pFVar2;
  FT_Memory pFVar3;
  int iVar4;
  FT_Error FVar5;
  SVG_RendererHooks *hooks;
  
  iVar4 = strcmp(property_name,"svg-hooks");
  FVar5 = 0xc;
  if (iVar4 == 0) {
    pFVar1 = module[5].memory;
    pFVar2 = module[6].clazz;
    pFVar3 = module[6].memory;
    *(FT_Library *)((long)value + 0x10) = module[6].library;
    *(FT_Memory *)((long)value + 0x18) = pFVar3;
    *(FT_Memory *)value = pFVar1;
    *(FT_Module_Class **)((long)value + 8) = pFVar2;
    FVar5 = 0;
  }
  return FVar5;
}

Assistant:

static FT_Error
  ft_svg_property_get( FT_Module    module,
                       const char*  property_name,
                       const void*  value )
  {
    FT_Error      error    = FT_Err_Ok;
    SVG_Renderer  renderer = (SVG_Renderer)module;


    if ( !ft_strcmp( property_name, "svg-hooks" ) )
    {
      SVG_RendererHooks*  hooks = (SVG_RendererHooks*)value;


      *hooks = renderer->hooks;
    }
    else
      error = FT_THROW( Missing_Property );

    return error;
  }